

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::LoadedSourceEvent>::destruct
          (BasicTypeInfo<dap::LoadedSourceEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::LoadedSourceEvent> *this_local;
  
  LoadedSourceEvent::~LoadedSourceEvent((LoadedSourceEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }